

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

string * __thiscall
flatbuffers::ts::TsGenerator::GenObjApiUnionTypeTS
          (string *__return_storage_ptr__,TsGenerator *this,import_set *imports,StructDef *dependent
          ,IDLOptions *param_3,EnumDef *union_enum)

{
  iterator iVar1;
  bool bVar2;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar3;
  reference ppEVar4;
  reference __lhs;
  _Base_ptr p_Var5;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  _Self local_1b8;
  _Self local_1b0;
  iterator it_1;
  size_t totalPrinted;
  ImportDefinition local_190;
  allocator<char> local_b9;
  undefined1 local_b8 [8];
  string type;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_88;
  const_iterator it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  type_list;
  allocator<char> local_3a;
  byte local_39;
  EnumDef *local_38;
  EnumDef *union_enum_local;
  IDLOptions *param_3_local;
  StructDef *dependent_local;
  import_set *imports_local;
  TsGenerator *this_local;
  string *ret;
  
  local_39 = 0;
  local_38 = union_enum;
  union_enum_local = (EnumDef *)param_3;
  param_3_local = (IDLOptions *)dependent;
  dependent_local = (StructDef *)imports;
  imports_local = (import_set *)this;
  this_local = (TsGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_3a);
  std::allocator<char>::~allocator(&local_3a);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&it);
  pvVar3 = EnumDef::Vals(local_38);
  local_88._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar3);
  do {
    pvVar3 = EnumDef::Vals(local_38);
    ev = (EnumVal *)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar3);
    bVar2 = __gnu_cxx::operator!=
                      (&local_88,
                       (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                        *)&ev);
    if (!bVar2) {
      it_1._M_node = (_Base_ptr)0x0;
      local_1b0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&it);
      while( true ) {
        local_1b8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&it);
        bVar2 = std::operator!=(&local_1b0,&local_1b8);
        if (!bVar2) break;
        it_1._M_node = (_Base_ptr)((long)&(it_1._M_node)->_M_color + 1);
        __lhs = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_1b0);
        iVar1._M_node = it_1._M_node;
        p_Var5 = (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&it);
        __rhs = "|";
        if (iVar1._M_node == p_Var5) {
          __rhs = "";
        }
        std::operator+(&local_1d8,__lhs,__rhs);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_1b0);
      }
      local_39 = 1;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&it);
      if ((local_39 & 1) == 0) {
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    ppEVar4 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_88);
    type.field_2._8_8_ = *ppEVar4;
    bVar2 = EnumVal::IsZero((EnumVal *)type.field_2._8_8_);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"",&local_b9);
      std::allocator<char>::~allocator(&local_b9);
      bVar2 = IsString((Type *)(type.field_2._8_8_ + 0x38));
      if (bVar2) {
        std::__cxx11::string::operator=((string *)local_b8,"string");
      }
      else {
        if (*(int *)(type.field_2._8_8_ + 0x38) != 0xf) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_ts.cpp"
                        ,0x3c4,
                        "std::string flatbuffers::ts::TsGenerator::GenObjApiUnionTypeTS(import_set &, const StructDef &, const IDLOptions &, const EnumDef &)"
                       );
        }
        AddImport<flatbuffers::StructDef>
                  (&local_190,this,(import_set *)dependent_local,(Definition *)param_3_local,
                   *(StructDef **)(type.field_2._8_8_ + 0x40));
        std::__cxx11::string::operator=((string *)local_b8,(string *)&local_190.object_name);
        anon_unknown_10::ImportDefinition::~ImportDefinition(&local_190);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&it,(value_type *)local_b8);
      std::__cxx11::string::~string((string *)local_b8);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_88);
  } while( true );
}

Assistant:

std::string GenObjApiUnionTypeTS(import_set &imports,
                                   const StructDef &dependent,
                                   const IDLOptions &,
                                   const EnumDef &union_enum) {
    std::string ret = "";
    std::set<std::string> type_list;

    for (auto it = union_enum.Vals().begin(); it != union_enum.Vals().end();
         ++it) {
      const auto &ev = **it;
      if (ev.IsZero()) { continue; }

      std::string type = "";
      if (IsString(ev.union_type)) {
        type = "string";  // no need to wrap string type in namespace
      } else if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
        type = AddImport(imports, dependent, *ev.union_type.struct_def)
                   .object_name;
      } else {
        FLATBUFFERS_ASSERT(false);
      }
      type_list.insert(type);
    }

    size_t totalPrinted = 0;
    for (auto it = type_list.begin(); it != type_list.end(); ++it) {
      ++totalPrinted;
      ret += *it + ((totalPrinted == type_list.size()) ? "" : "|");
    }

    return ret;
  }